

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

xmlNsPtr * xmlGetNsList(xmlDoc *doc,xmlNode *node)

{
  bool bVar1;
  int iVar2;
  xmlNsPtr *ppxVar3;
  int iVar4;
  xmlNsPtr pxVar5;
  xmlChar *str2;
  xmlChar *str1;
  uint uVar6;
  ulong uVar7;
  
  if ((node == (xmlNode *)0x0) || (uVar6 = 0, node->type == XML_NAMESPACE_DECL)) {
    ppxVar3 = (xmlNsPtr *)0x0;
  }
  else {
    iVar4 = 10;
    ppxVar3 = (xmlNsPtr *)0x0;
    do {
      if (node->type == XML_ELEMENT_NODE) {
        for (pxVar5 = node->nsDef; pxVar5 != (xmlNsPtr)0x0; pxVar5 = pxVar5->next) {
          if (ppxVar3 == (xmlNsPtr *)0x0) {
            ppxVar3 = (xmlNsPtr *)(*xmlMalloc)((long)iVar4 * 8 + 8);
            if (ppxVar3 == (xmlNsPtr *)0x0) goto LAB_001875f0;
            ppxVar3[(int)uVar6] = (xmlNsPtr)0x0;
          }
          bVar1 = 0 < (int)uVar6;
          if ((int)uVar6 < 1) {
LAB_00187588:
            if (iVar4 <= (int)uVar6) {
              ppxVar3 = (xmlNsPtr *)(*xmlRealloc)(ppxVar3,(long)(iVar4 * 2 + 1) << 3);
              if (ppxVar3 == (xmlNsPtr *)0x0) {
LAB_001875f0:
                __xmlSimpleError(2,2,(xmlNodePtr)0x0,(char *)0x0,"getting namespace list");
                return (xmlNsPtr *)0x0;
              }
              iVar4 = iVar4 * 2;
            }
            ppxVar3[(int)uVar6] = pxVar5;
            ppxVar3[(long)(int)uVar6 + 1] = (xmlNsPtr)0x0;
            uVar6 = uVar6 + 1;
          }
          else {
            str1 = pxVar5->prefix;
            str2 = (*ppxVar3)->prefix;
            if (str1 != str2) {
              uVar7 = 1;
              do {
                iVar2 = xmlStrEqual(str1,str2);
                if (iVar2 != 0) break;
                if (uVar6 == uVar7) goto LAB_00187588;
                bVar1 = uVar7 < uVar6;
                str1 = pxVar5->prefix;
                str2 = ppxVar3[uVar7]->prefix;
                uVar7 = uVar7 + 1;
              } while (str1 != str2);
            }
            if (!bVar1) goto LAB_00187588;
          }
        }
      }
      node = node->parent;
    } while (node != (_xmlNode *)0x0);
  }
  return ppxVar3;
}

Assistant:

xmlNsPtr *
xmlGetNsList(const xmlDoc *doc ATTRIBUTE_UNUSED, const xmlNode *node)
{
    xmlNsPtr cur;
    xmlNsPtr *ret = NULL;
    int nbns = 0;
    int maxns = 10;
    int i;

    if ((node == NULL) || (node->type == XML_NAMESPACE_DECL))
        return(NULL);

    while (node != NULL) {
        if (node->type == XML_ELEMENT_NODE) {
            cur = node->nsDef;
            while (cur != NULL) {
                if (ret == NULL) {
                    ret =
                        (xmlNsPtr *) xmlMalloc((maxns + 1) *
                                               sizeof(xmlNsPtr));
                    if (ret == NULL) {
			xmlTreeErrMemory("getting namespace list");
                        return (NULL);
                    }
                    ret[nbns] = NULL;
                }
                for (i = 0; i < nbns; i++) {
                    if ((cur->prefix == ret[i]->prefix) ||
                        (xmlStrEqual(cur->prefix, ret[i]->prefix)))
                        break;
                }
                if (i >= nbns) {
                    if (nbns >= maxns) {
                        maxns *= 2;
                        ret = (xmlNsPtr *) xmlRealloc(ret,
                                                      (maxns +
                                                       1) *
                                                      sizeof(xmlNsPtr));
                        if (ret == NULL) {
			    xmlTreeErrMemory("getting namespace list");
                            return (NULL);
                        }
                    }
                    ret[nbns++] = cur;
                    ret[nbns] = NULL;
                }

                cur = cur->next;
            }
        }
        node = node->parent;
    }
    return (ret);
}